

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_manager.cpp
# Opt level: O2

shared_ptr<cab> __thiscall
cab_manager::find_cab(cab_manager *this,node_type src,node_type dst,uint32_t passengers)

{
  pointer pnVar1;
  pointer pwVar2;
  uint32_t uVar3;
  int32_t iVar4;
  iterator iVar5;
  mapped_type *__x;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000031;
  long lVar6;
  int in_R8D;
  uint uVar7;
  pointer pnVar8;
  __weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  shared_ptr<cab> sVar10;
  node_type current;
  node_type src_local;
  uint local_144;
  size_type *local_140;
  shared_ptr<cab> shared;
  vector<node_type,_std::allocator<node_type>_> vec;
  vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_> cabs;
  deque<node_type,_std::allocator<node_type>_> queue;
  _Deque_iterator<node_type,_node_type_&,_node_type_*> local_78;
  _Deque_iterator<node_type,_node_type_&,_node_type_*> local_58;
  
  lVar6 = CONCAT71(in_register_00000031,src);
  src_local = dst;
  std::_Deque_base<node_type,_std::allocator<node_type>_>::_Deque_base
            (&queue.super__Deque_base<node_type,_std::allocator<node_type>_>);
  std::deque<node_type,_std::allocator<node_type>_>::push_back
            ((deque<node_type,_std::allocator<node_type>_> *)
             &queue.super__Deque_base<node_type,_std::allocator<node_type>_>,&src_local);
  local_140 = &(this->_cabs)._M_h._M_bucket_count;
  local_144 = 0;
  do {
    if (queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
LAB_001576f3:
      (this->_cabs)._M_h._M_buckets = (__buckets_ptr)0x0;
      (this->_cabs)._M_h._M_bucket_count = 0;
LAB_001576fb:
      std::_Deque_base<node_type,_std::allocator<node_type>_>::~_Deque_base
                (&queue.super__Deque_base<node_type,_std::allocator<node_type>_>);
      sVar10.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar10.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
      return (shared_ptr<cab>)sVar10.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>;
    }
    current = *queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
    std::deque<node_type,_std::allocator<node_type>_>::pop_front(&queue);
    (this->_cabs)._M_h._M_buckets = (__buckets_ptr)0x0;
    (this->_cabs)._M_h._M_bucket_count = 0;
    iVar5 = std::
            _Rb_tree<node_type,_std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>,_std::_Select1st<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
            ::find((_Rb_tree<node_type,_std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>,_std::_Select1st<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
                    *)(lVar6 + 0x40),&current);
    if (iVar5._M_node != (_Base_ptr)(lVar6 + 0x48)) {
      __x = std::
            map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
            ::operator[]((map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
                          *)(lVar6 + 0x40),&current);
      std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::vector(&cabs,__x);
      pwVar2 = cabs.super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      uVar7 = 0x7fffffff;
      for (p_Var9 = &(cabs.
                      super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>.
                      _M_impl.super__Vector_impl_data._M_start)->
                     super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>;
          p_Var9 != &pwVar2->super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>; p_Var9 = p_Var9 + 1)
      {
        std::__weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                  ((__weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2> *)&vec,p_Var9);
        std::__shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&shared.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>,
                   (__weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2> *)&vec);
        uVar3 = cab::passengers_at_node
                          ((cab *)CONCAT71(shared.
                                           super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_ptr._1_7_,
                                           (node_type)
                                           shared.
                                           super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_ptr),src_local);
        if (uVar3 + in_R8D < 5) {
          iVar4 = cab::calculate_costs
                            ((cab *)CONCAT71(shared.
                                             super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>.
                                             _M_ptr._1_7_,
                                             (node_type)
                                             shared.
                                             super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>.
                                             _M_ptr),src_local,(node_type)passengers);
          uVar3 = cab::costs((cab *)CONCAT71(shared.
                                             super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>.
                                             _M_ptr._1_7_,
                                             (node_type)
                                             shared.
                                             super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>.
                                             _M_ptr));
          if (iVar4 - uVar3 < uVar7) {
            uVar3 = cab::costs((cab *)CONCAT71(shared.
                                               super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>.
                                               _M_ptr._1_7_,
                                               (node_type)
                                               shared.
                                               super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>.
                                               _M_ptr));
            uVar7 = iVar4 - uVar3;
            std::__shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2> *)this,
                       &shared.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&shared.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                   &vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
                    super__Vector_impl_data._M_finish);
      }
      std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::~vector(&cabs);
      if (uVar7 != 0x7fffffff) goto LAB_001576fb;
    }
    road_network::get_predecessors(&vec,(road_network *)(lVar6 + 0x70),current);
    pnVar1 = vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pnVar8 = vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
                  super__Vector_impl_data._M_start; pnVar8 != pnVar1; pnVar8 = pnVar8 + 1) {
      shared.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ = *pnVar8;
      local_58._M_cur =
           queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
      local_58._M_first =
           queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
           super__Deque_impl_data._M_start._M_first;
      local_58._M_last =
           queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
      local_58._M_node =
           queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
           super__Deque_impl_data._M_start._M_node;
      local_78._M_cur =
           queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
      local_78._M_first =
           queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
           super__Deque_impl_data._M_finish._M_first;
      local_78._M_last =
           queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
           super__Deque_impl_data._M_finish._M_last;
      local_78._M_node =
           queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
           super__Deque_impl_data._M_finish._M_node;
      std::find<std::_Deque_iterator<node_type,node_type&,node_type*>,node_type>
                ((_Deque_iterator<node_type,_node_type_&,_node_type_*> *)&cabs,&local_58,&local_78,
                 (node_type *)&shared.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>);
      if (cabs.super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (pointer)queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur) {
        std::deque<node_type,_std::allocator<node_type>_>::push_back
                  (&queue,(value_type *)&shared.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>)
        ;
      }
    }
    if ((*queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur == src_local & (byte)local_144) != 0) {
      std::_Vector_base<node_type,_std::allocator<node_type>_>::~_Vector_base
                (&vec.super__Vector_base<node_type,_std::allocator<node_type>_>);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_140);
      goto LAB_001576f3;
    }
    local_144 = local_144 & 0xff;
    if (*queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur == src_local) {
      local_144 = 1;
    }
    std::_Vector_base<node_type,_std::allocator<node_type>_>::~_Vector_base
              ((_Vector_base<node_type,_std::allocator<node_type>_> *)&vec);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_140);
  } while( true );
}

Assistant:

std::shared_ptr<cab> cab_manager::find_cab(node_type src, node_type dst, std::uint32_t passengers)
{
    bool cycle = false;
    std::deque<node_type> queue;
    queue.push_back(src);

    while(!queue.empty())
    {
        node_type current = queue.front();
        queue.pop_front();

        std::int32_t min = INT32_MAX;
        std::shared_ptr<cab> chosen = nullptr;
        if(_cabs_at_node.find(current) != _cabs_at_node.end())
        {
            std::vector<std::weak_ptr<cab>> cabs = _cabs_at_node[current];
            for(auto cab : cabs)
            {
                auto shared = cab.lock();
                if(shared->passengers_at_node(src) + passengers > 4)
                {
                    continue;
                }

                // calculate cost
                std::int32_t cost = shared->calculate_costs(src, dst);
                if((cost - shared->costs()) < min)
                {
                    min = cost - shared->costs();
                    chosen = shared;
                }
            }
        }

        if(min != INT32_MAX)
        {
            return chosen;
        }

        std::vector<node_type> vec = _rnet.get_predecessors(current);
        for(auto n : vec)
        {
            auto it = std::find(queue.begin(), queue.end(), n);
            if(it == queue.end())
            {
                queue.push_back(n);
            }
        }

        // break after two cycles due to edge case src = P4
        if(queue.front() == src && cycle)
        {
            break;
        }
        else if (queue.front() == src && !cycle)
        {
            cycle = true;
        }
        
    }
    return nullptr;
}